

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O0

uint16 __thiscall crnlib::rg_etc1::etc1_block::get_base4_color(etc1_block *this,uint idx)

{
  uint uVar1;
  undefined2 local_20;
  undefined4 local_1c;
  uint b;
  uint g;
  uint r;
  uint idx_local;
  etc1_block *this_local;
  
  if (idx == 0) {
    b = get_byte_bits(this,0x3c,4);
    local_1c = get_byte_bits(this,0x34,4);
    uVar1 = get_byte_bits(this,0x2c,4);
    local_20 = (ushort)uVar1;
  }
  else {
    b = get_byte_bits(this,0x38,4);
    local_1c = get_byte_bits(this,0x30,4);
    uVar1 = get_byte_bits(this,0x28,4);
    local_20 = (ushort)uVar1;
  }
  return local_20 | (ushort)(local_1c << 4) | (ushort)(b << 8);
}

Assistant:

inline uint16 get_base4_color(uint idx) const
            {
                uint r, g, b;
                if (idx)
                {
                    r = get_byte_bits(cETC1AbsColor4R2BitOffset, 4);
                    g = get_byte_bits(cETC1AbsColor4G2BitOffset, 4);
                    b = get_byte_bits(cETC1AbsColor4B2BitOffset, 4);
                }
                else
                {
                    r = get_byte_bits(cETC1AbsColor4R1BitOffset, 4);
                    g = get_byte_bits(cETC1AbsColor4G1BitOffset, 4);
                    b = get_byte_bits(cETC1AbsColor4B1BitOffset, 4);
                }
                return static_cast<uint16>(b | (g << 4U) | (r << 8U));
            }